

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O1

array<unsigned_char,_4UL>
mvm::num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>(string *str)

{
  int iVar1;
  pointer pcVar2;
  char *__nptr;
  long lVar3;
  int *piVar4;
  ulonglong uVar5;
  undefined8 uVar6;
  int __base;
  long *local_58 [2];
  long local_48 [2];
  char *local_38;
  
  local_58[0] = local_48;
  pcVar2 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + str->_M_string_length);
  lVar3 = std::__cxx11::string::find_first_of((char *)local_58,0x117dee,0);
  __base = 10;
  if (lVar3 == 0) {
    __base = 0x10;
  }
  __nptr = (str->_M_dataplus)._M_p;
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  uVar5 = strtoull(__nptr,&local_38,__base);
  if (local_38 == __nptr) {
    uVar6 = std::__throw_invalid_argument("stoull");
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    _Unwind_Resume(uVar6);
  }
  if (*piVar4 != 0) {
    if (*piVar4 != 0x22) goto LAB_00116308;
    std::__throw_out_of_range("stoull");
  }
  *piVar4 = iVar1;
LAB_00116308:
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return (array<unsigned_char,_4UL>)SUB84(uVar5,0);
}

Assistant:

std::array<uint8_t, N> serial(std::string const &str) {
  std::array<uint8_t, N> res;
  if constexpr (std::is_floating_point_v<T>) {
    res = serial_floating<T, N>(std::stod(str));
  } else if constexpr (std::is_integral_v<T> && std::is_unsigned_v<T>) {
    res = serial_unsigned<N>(std::stoull(str, nullptr, details::base(str)));
  } else if constexpr (std::is_integral_v<T> && std::is_signed_v<T>) {
    res = serial_signed<T, N>(std::stoll(str, nullptr, details::base(str)));
  }

  return details::to_endian<N, little_endian_tag, Endian>()(&res[0]);
}